

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O3

int ERKStepWriteButcher(void *arkode_mem,FILE *fp)

{
  int iVar1;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeERKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = erkStep_AccessARKODEStepMem(arkode_mem,"ERKStepWriteButcher",&local_18,&local_20);
  if (iVar1 == 0) {
    if (local_20->B == (ARKodeButcherTable)0x0) {
      iVar1 = -0x15;
      arkProcessError(local_18,-0x15,0x2ec,"ERKStepWriteButcher",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep_io.c"
                      ,"Butcher table memory is NULL");
    }
    else {
      iVar1 = 0;
      fprintf((FILE *)fp,"\nERKStep Butcher table (stages = %i):\n",(ulong)(uint)local_20->stages);
      ARKodeButcherTable_Write(local_20->B,fp);
      fputc(10,(FILE *)fp);
    }
  }
  return iVar1;
}

Assistant:

int ERKStepWriteButcher(void* arkode_mem, FILE* fp)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;

  /* access ARKodeMem and ARKodeERKStepMem structures */
  retval = erkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check that Butcher table is non-NULL (otherwise report error) */
  if (step_mem->B == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "Butcher table memory is NULL");
    return (ARK_MEM_NULL);
  }

  /* print Butcher table to file */
  fprintf(fp, "\nERKStep Butcher table (stages = %i):\n", step_mem->stages);
  ARKodeButcherTable_Write(step_mem->B, fp);
  fprintf(fp, "\n");

  return (ARK_SUCCESS);
}